

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_contains(roaring_bitmap_t *r,uint32_t val)

{
  _Bool _Var1;
  uint uVar2;
  
  uVar2 = ra_get_index(&r->high_low_container,(uint16_t)(val >> 0x10));
  if (-1 < (int)uVar2) {
    _Var1 = container_contains((r->high_low_container).containers[uVar2 & 0xffff],(uint16_t)val,
                               (r->high_low_container).typecodes[uVar2 & 0xffff]);
    return _Var1;
  }
  return false;
}

Assistant:

bool roaring_bitmap_contains(const roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    /*
     * the next function call involves a binary search and lots of branching.
     */
    int32_t i = ra_get_index(&r->high_low_container, hb);
    if (i < 0) return false;

    uint8_t typecode;
    // next call ought to be cheap
    container_t *container = ra_get_container_at_index(&r->high_low_container,
                                                       (uint16_t)i, &typecode);
    // rest might be a tad expensive, possibly involving another round of binary
    // search
    return container_contains(container, val & 0xFFFF, typecode);
}